

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindGreater(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
           BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,bool EQ)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_00;
  long lVar7;
  Addr Cp;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> C;
  Addr local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_d0,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->RootAddr).FileOff != -1) {
    if (EQ) {
      k_00 = &local_70;
      std::__cxx11::string::string((string *)k_00,(string *)k);
      iVar2 = FindFirstKey(this,k_00,&local_f0);
    }
    else {
      k_00 = &local_50;
      std::__cxx11::string::string((string *)k_00,(string *)k);
      iVar2 = FindNextKey(this,k_00,&local_f0);
    }
    std::__cxx11::string::~string((string *)k_00);
    if (iVar2 != -1) {
      FindNode(this,local_f0,&local_d0);
      local_e8 = (long)iVar2;
      do {
        local_d8 = local_e8 << 0x20;
        local_e0 = local_e8 * 8;
        lVar4 = local_d8;
        lVar6 = local_e0;
        lVar7 = local_e8;
        do {
          do {
            while( true ) {
              lVar3 = (long)this->N;
              if ((lVar3 + -1 <= lVar7) ||
                 (local_d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7] != '1')) break;
              std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
              _M_insert_unique<Addr_const&>
                        ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                          *)__return_storage_ptr__,
                         (Addr *)((long)&(local_d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->BlockNum +
                                 lVar6));
              lVar4 = lVar4 + 0x100000000;
              lVar6 = lVar6 + 8;
              lVar7 = lVar7 + 1;
            }
            if ((int)lVar7 == (int)(lVar3 + -1)) {
              if (local_d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3 + -1].FileOff == -1) goto LAB_0012a69f;
              goto LAB_0012a67d;
            }
            lVar5 = lVar4 >> 0x20;
            lVar4 = local_d8;
            lVar6 = local_e0;
            lVar7 = local_e8;
          } while (local_d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5] != '0');
          if (local_d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3 + -1].FileOff == -1) goto LAB_0012a69f;
        } while (local_d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5] != '0');
LAB_0012a67d:
        FindNode(this,local_d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar3 + -1],&local_d0);
        local_e8 = 0;
      } while( true );
    }
    std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::clear
              (&__return_storage_ptr__->_M_t);
  }
LAB_0012a69f:
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindGreater(K k, bool EQ) {
	IndexNode<K> C(N);
	set<Addr> ret;
	int i, pos;
	Addr Cp;
	if (this->RootAddr.FileOff == -1)
		return ret;
	if (EQ == false) {
		pos = this->FindNextKey(k, Cp);
	}
	else {
		pos = this->FindFirstKey(k, Cp);
	}
    if(pos == -1){
        ret.clear();
        return ret;
    }
	this->FindNode(Cp, C);
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1'; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;
		}
		else if (i == N - 1 || C.v[i] == '0') {
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
	}
	return ret;
}